

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeMixing(ProjectWriter *this)

{
  Node *pNVar1;
  bool bVar2;
  int iVar3;
  _Setw _Var4;
  _Setprecision _Var5;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  reference ppNVar6;
  ostream *poVar7;
  Tank *tank;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  ProjectWriter *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[MIXING]\n");
  this_00 = &this->network->nodes;
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_00);
  node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                *)&node);
    if (!bVar2) break;
    ppNVar6 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    pNVar1 = *ppNVar6;
    iVar3 = (*(pNVar1->super_Element)._vptr_Element[2])();
    if (iVar3 == 1) {
      poVar7 = (ostream *)std::ostream::operator<<(&this->field_0x18,std::left);
      _Var4 = std::setw(0x10);
      poVar7 = std::operator<<(poVar7,_Var4);
      poVar7 = std::operator<<(poVar7,(string *)&(pNVar1->super_Element).name);
      std::operator<<(poVar7," ");
      _Var4 = std::setw(0xc);
      poVar7 = std::operator<<((ostream *)&this->field_0x18,_Var4);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::fixed);
      _Var5 = std::setprecision(4);
      std::operator<<(poVar7,_Var5);
      std::operator<<((ostream *)&this->field_0x18,
                      TankMixModel::MixingModelWords[*(int *)&pNVar1[1].xCoord]);
      poVar7 = (ostream *)std::ostream::operator<<(&this->field_0x18,pNVar1[1].initQual);
      std::operator<<(poVar7,"\n");
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writeMixing()
{
    fout << "\n[MIXING]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::TANK )
    	{
    	    Tank* tank = static_cast<Tank*>(node);
    	    fout << left << setw(16) << node->name << " ";
    	    fout << setw(12) << fixed << setprecision(4);
    	    fout << TankMixModel::MixingModelWords[tank->mixingModel.type];
    	    fout << tank->mixingModel.fracMixed << "\n";
    	}
    }
}